

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int unixFullPathname(sqlite3_vfs *pVfs,char *zPath,int nOut,char *zOut)

{
  long lVar1;
  uint *puVar2;
  int iVar3;
  DbPath path;
  char zPwd [4098];
  DbPath local_1040;
  char local_1028 [4112];
  
  local_1040.rc = 0;
  local_1040.nSymlink = 0;
  local_1040.nUsed = 0;
  local_1040.zOut = zOut;
  local_1040.nOut = nOut;
  if (*zPath != '/') {
    lVar1 = (*aSyscall[3].pCurrent)(local_1028,0x1000);
    if (lVar1 == 0) {
      sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0xb021,
                  "c9c2ab54ba1f5f46360f1b4f35d849cd3f080e6fc2b6c60e91b16c63f69a1e33");
      puVar2 = (uint *)__errno_location();
      sqlite3_log(0xe,"os_unix.c:%d: (%d) %s(%s) - %s",0xb021,(ulong)*puVar2,"getcwd",zPath,"");
      return 0xe;
    }
    appendAllPathElements(&local_1040,local_1028);
  }
  appendAllPathElements(&local_1040,zPath);
  zOut[local_1040.nUsed] = '\0';
  if (((long)local_1040.nUsed < 2) || (local_1040.rc != 0)) {
    iVar3 = 0xe;
    sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0xb027,
                "c9c2ab54ba1f5f46360f1b4f35d849cd3f080e6fc2b6c60e91b16c63f69a1e33");
  }
  else {
    iVar3 = (uint)(local_1040.nSymlink != 0) << 9;
  }
  return iVar3;
}

Assistant:

static int unixFullPathname(
  sqlite3_vfs *pVfs,            /* Pointer to vfs object */
  const char *zPath,            /* Possibly relative input path */
  int nOut,                     /* Size of output buffer in bytes */
  char *zOut                    /* Output buffer */
){
  DbPath path;
  UNUSED_PARAMETER(pVfs);
  path.rc = 0;
  path.nUsed = 0;
  path.nSymlink = 0;
  path.nOut = nOut;
  path.zOut = zOut;
  if( zPath[0]!='/' ){
    char zPwd[SQLITE_MAX_PATHLEN+2];
    if( osGetcwd(zPwd, sizeof(zPwd)-2)==0 ){
      return unixLogError(SQLITE_CANTOPEN_BKPT, "getcwd", zPath);
    }
    appendAllPathElements(&path, zPwd);
  }
  appendAllPathElements(&path, zPath);
  zOut[path.nUsed] = 0;
  if( path.rc || path.nUsed<2 ) return SQLITE_CANTOPEN_BKPT;
  if( path.nSymlink ) return SQLITE_OK_SYMLINK;
  return SQLITE_OK;
}